

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::setWindowRole(QWidget *this,QString *role)

{
  QWidgetPrivate *this_00;
  long lVar1;
  long *plVar2;
  undefined1 auVar3 [16];
  
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  QWidgetPrivate::createTLExtra(this_00);
  QWidgetPrivate::createTLExtra(this_00);
  QString::operator=((QString *)
                     ((long)(((this_00->extra)._M_t.
                              super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                              super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                              super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                            super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0x58
                     ),(QString *)role);
  lVar1 = *(long *)(*(long *)&this->field_0x8 + 0x78);
  if (((lVar1 != 0) && (lVar1 = *(long *)(lVar1 + 8), lVar1 != 0)) && (*(long *)(lVar1 + 0x20) != 0)
     ) {
    lVar1 = QWindow::handle();
    if (lVar1 != 0) {
      auVar3 = __dynamic_cast(lVar1,&QPlatformWindow::typeinfo,
                              &QNativeInterface::Private::QXcbWindow::typeinfo,0xfffffffffffffffe);
      plVar2 = auVar3._0_8_;
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x18))(plVar2,role,auVar3._8_8_,*(code **)(*plVar2 + 0x18));
        return;
      }
    }
  }
  return;
}

Assistant:

void QWidget::setWindowRole(const QString &role)
{
#if QT_CONFIG(xcb)
    Q_D(QWidget);
    d->createTLExtra();
    d->topData()->role = role;
    if (windowHandle()) {
        if (auto *xcbWindow = dynamic_cast<QXcbWindow*>(windowHandle()->handle()))
            xcbWindow->setWindowRole(role);
    }
#else
    Q_UNUSED(role);
#endif
}